

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O1

ze_result_t
driver::zeEventGetEventPool(ze_event_handle_t hEvent,ze_event_pool_handle_t *phEventPool)

{
  ze_result_t zVar1;
  
  if (DAT_0010e5b0 != (code *)0x0) {
    zVar1 = (*DAT_0010e5b0)();
    return zVar1;
  }
  context_t::get()::count = (ze_event_pool_handle_t)((long)context_t::get()::count + 1);
  *phEventPool = context_t::get()::count;
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventGetEventPool(
        ze_event_handle_t hEvent,                       ///< [in] handle of the event
        ze_event_pool_handle_t* phEventPool             ///< [out] handle of the event pool for the event
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetEventPool = context.zeDdiTable.Event.pfnGetEventPool;
        if( nullptr != pfnGetEventPool )
        {
            result = pfnGetEventPool( hEvent, phEventPool );
        }
        else
        {
            // generic implementation
            *phEventPool = reinterpret_cast<ze_event_pool_handle_t>( context.get() );

        }

        return result;
    }